

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

void monitor_call(void)

{
  if (teletext != '\0') {
    setgraphmode(0);
    monitor();
    flash();
    restorecrtmode();
    (*update_screen)();
  }
  if (teletext != '\0') {
    return;
  }
  setvisualpage(1);
  setactivepage(1);
  monitor();
  flash();
  setvisualpage(0);
  setactivepage(0);
  return;
}

Assistant:

void monitor_call(void) {            // Is called when home is pressed

    if (teletext) {
        setgraphmode(VGAMED);
        monitor();
        flash();
        restorecrtmode();
        update_screen();
    }
    if (!teletext) {
        setvisualpage(1);
        setactivepage(1);
        monitor();
        flash();
        setvisualpage(0);
        setactivepage(0);
    }

}